

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwd.c
# Opt level: O1

int pwdMain(int argc,char **argv)

{
  int iVar1;
  err_t code;
  char *pcVar2;
  cmd_pwd_t pwd;
  cmd_pwd_t local_20;
  
  if (argc < 3) {
    printf("bee2cmd/%s: %s\nUsage:\n  pwd gen <schema>\n    generate password according to <schema>\n  pwd val <schema>\n    validate password built by <schema>\n  pwd print <schema>\n    print password built by <schema>\n  schemas:\n    pass:<pwd> -- direct password\n    env:<name> -- password in environment variable <name>\n    share:\"[options] <share1> <share2> ...\" -- shared password\n      options:\n        -t<nn> --- threshold (2 <= <nn> <= 16, 2 by default)\n        -l<mmm> --- password bitlen: 128, 192 or 256 (by default)\n        -crc --- password contains 64-bit crc (<mmm> != 128)\n        -pass <schema> --- password to protect shares\n"
           ,"pwd","generate and manage passwords");
    return -1;
  }
  iVar1 = strCmp(argv[1],"gen");
  if (iVar1 == 0) {
    local_20 = (char *)0x0;
    code = 0x25b;
    if ((argc != 3) || (code = cmdStDo(0x16), code != 0)) goto LAB_0010c4c8;
    code = cmdPwdGen(&local_20,argv[2]);
  }
  else {
    iVar1 = strCmp(argv[1],"val");
    if (iVar1 != 0) {
      iVar1 = strCmp(argv[1],"print");
      code = 0x259;
      if (iVar1 == 0) {
        local_20 = (char *)0x0;
        code = 0x25b;
        if ((argc == 3) && (code = cmdPwdRead(&local_20,argv[2]), code == 0)) {
          puts(local_20);
          cmdPwdClose(local_20);
          code = 0;
        }
      }
      goto LAB_0010c4c8;
    }
    local_20 = (char *)0x0;
    code = 0x25b;
    if ((argc != 3) || (code = cmdStDo(6), code != 0)) goto LAB_0010c4c8;
    code = cmdPwdRead(&local_20,argv[2]);
  }
  cmdPwdClose(local_20);
LAB_0010c4c8:
  if ((code != 0) || (iVar1 = strCmp(argv[1],"val"), iVar1 == 0)) {
    pcVar2 = errMsg(code);
    printf("bee2cmd/%s: %s\n","pwd",pcVar2);
  }
  return -(uint)(code != 0);
}

Assistant:

int pwdMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 3)
		return pwdUsage();
	// разбор
	++argv, --argc;
	if (strEq(argv[0], "gen"))
		code = pwdGen(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = pwdVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = pwdPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}